

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall NumberTemp::ProcessInstr(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  SymID stackSymID;
  Type TVar1;
  Opnd *this_00;
  SymTable *this_01;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  StackSym *pSVar7;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  PropertySym *pPVar9;
  BVSparse<Memory::JitArenaAllocator> **ppBVar10;
  BVUnitT<unsigned_long> local_38;
  SparseBVUnit _unit;
  
  if (instr->m_opcode == BailOnNoProfile) {
    if (this->nonTempElemLoad == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,600,"(!this->nonTempElemLoad)","!this->nonTempElemLoad");
      if (!bVar4) goto LAB_005bd929;
      *puVar5 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      ((BVSparse<Memory::JitArenaAllocator> *)this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x259,"(this->nonTempSyms.IsEmpty())","this->nonTempSyms.IsEmpty()");
      if (!bVar4) goto LAB_005bd929;
      *puVar5 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (&(this->super_TempTrackerBase).tempTransferredSyms);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25a,"(this->tempTransferredSyms.IsEmpty())",
                         "this->tempTransferredSyms.IsEmpty()");
      if (!bVar4) goto LAB_005bd929;
      *puVar5 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(&this->elemLoadDependencies);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25b,"(this->elemLoadDependencies.IsEmpty())",
                         "this->elemLoadDependencies.IsEmpty()");
      if (!bVar4) goto LAB_005bd929;
      *puVar5 = 0;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (&this->upwardExposedMarkTempObjectLiveFields);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25c,"(this->upwardExposedMarkTempObjectLiveFields.IsEmpty())",
                         "this->upwardExposedMarkTempObjectLiveFields.IsEmpty()");
      if (!bVar4) {
LAB_005bd929:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  bVar4 = DoMarkTempNumbersOnTempObjects(this,backwardPass);
  if (((bVar4) && (this_00 = instr->m_dst, this_00 != (Opnd *)0x0)) &&
     (bVar4 = IR::Opnd::IsRegOpnd(this_00), bVar4)) {
    pRVar6 = IR::Opnd::AsRegOpnd(this_00);
    pSVar7 = pRVar6->m_sym;
    if (((pSVar7->m_type == TyVar) ||
        (pSVar7 = StackSym::GetVarEquivSym(pSVar7,(Func *)0x0), pSVar7 != (StackSym *)0x0)) &&
       ((this->upwardExposedMarkTempObjectSymsProperties !=
         (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0 &&
        (bv2 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
                         (this->upwardExposedMarkTempObjectSymsProperties,(pSVar7->super_Sym).m_id),
        bv2 != (BVSparse<Memory::JitArenaAllocator> *)0x0)))) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this->upwardExposedMarkTempObjectLiveFields,bv2);
      bVar4 = ObjectTemp::IsTempTransfer(instr);
      if ((!bVar4) || (bVar4 = IR::Opnd::IsRegOpnd(instr->m_src1), !bVar4)) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  ((this->super_TempTrackerBase).nonTempSyms.alloc,bv2);
        return;
      }
      pRVar6 = IR::Opnd::AsRegOpnd(instr->m_src1);
      pSVar7 = Sym::AsStackSym(&pRVar6->m_sym->super_Sym);
      stackSymID = (pSVar7->super_Sym).m_id;
      this_01 = backwardPass->func->m_symTable;
      pBVar8 = bv2;
      while (pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)pBVar8->head,
            pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        TVar1 = *(Type *)&pBVar8->lastFoundIndex;
        local_38.word = ((Type *)&pBVar8->alloc)->word;
        while (local_38.word != 0) {
          lVar2 = 0;
          if (local_38.word != 0) {
            for (; (local_38.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear(&local_38,(BVIndex)lVar2);
          pPVar9 = SymTable::FindPropertySym(this_01,stackSymID,(BVIndex)lVar2 + TVar1);
          if (pPVar9 != (PropertySym *)0x0) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (&this->upwardExposedMarkTempObjectLiveFields,(pPVar9->super_Sym).m_id);
          }
        }
      }
      ppBVar10 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                 FindOrInsert(this->upwardExposedMarkTempObjectSymsProperties,bv2,stackSymID);
      if (ppBVar10 != (BVSparse<Memory::JitArenaAllocator> **)0x0) {
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>(*ppBVar10,bv2);
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  ((this->super_TempTrackerBase).nonTempSyms.alloc,bv2);
      }
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessInstr(IR::Instr * instr, BackwardPass * backwardPass)
{
#if DBG
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile)
    {
        // If we see BailOnNoProfile, we shouldn't have any successor to have any non temp syms
        Assert(!this->nonTempElemLoad);
        Assert(this->nonTempSyms.IsEmpty());
        Assert(this->tempTransferredSyms.IsEmpty());
        Assert(this->elemLoadDependencies.IsEmpty());
        Assert(this->upwardExposedMarkTempObjectLiveFields.IsEmpty());
    }
#endif

    // We don't get to process all dst in MarkTemp. Do it here for the upwardExposedMarkTempObjectLiveFields
    if (!this->DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        return;
    }

    IR::Opnd * dst = instr->GetDst();
    if (dst == nullptr || !dst->IsRegOpnd())
    {
        return;
    }
    StackSym * dstSym = dst->AsRegOpnd()->m_sym;
    if (!dstSym->IsVar())
    {
        dstSym = dstSym->GetVarEquivSym(nullptr);
        if (dstSym == nullptr)
        {
            return;
        }
    }

    SymID dstSymId = dstSym->m_id;
    if (this->upwardExposedMarkTempObjectSymsProperties)
    {
        // We are assigning to dstSym, it no longer has upward exposed use, get the information and clear it from the hash table
        BVSparse<JitArenaAllocator> * dstBv = this->upwardExposedMarkTempObjectSymsProperties->GetAndClear(dstSymId);
        if (dstBv)
        {
            // Clear the upward exposed live fields of all the property sym id associated to dstSym
            this->upwardExposedMarkTempObjectLiveFields.Minus(dstBv);
            if (ObjectTemp::IsTempTransfer(instr) && instr->GetSrc1()->IsRegOpnd())
            {
                // If it is transfer, copy the dst info to the src
                SymID srcStackSymId = instr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->m_id;

                SymTable * symTable = backwardPass->func->m_symTable;
                FOREACH_BITSET_IN_SPARSEBV(index, dstBv)
                {
                    PropertySym * propertySym = symTable->FindPropertySym(srcStackSymId, index);
                    if (propertySym)
                    {
                        this->upwardExposedMarkTempObjectLiveFields.Set(propertySym->m_id);
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;

                BVSparse<JitArenaAllocator> ** srcBv = this->upwardExposedMarkTempObjectSymsProperties->FindOrInsert(dstBv, srcStackSymId);
                if (srcBv)
                {
                    (*srcBv)->Or(dstBv);
                    JitAdelete(this->GetAllocator(), dstBv);
                }
            }
            else
            {
                JitAdelete(this->GetAllocator(), dstBv);
            }
        }
    }
}